

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> * __thiscall
cs_impl::any::const_val<std::shared_ptr<std::ostream>>(any *this)

{
  bool bVar1;
  type_info *__arg;
  error *peVar2;
  allocator local_31;
  string local_30;
  
  __arg = type(this);
  bVar1 = std::type_info::operator!=((type_info *)&std::shared_ptr<std::ostream>::typeinfo,__arg);
  if (bVar1) {
    peVar2 = (error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_30,"E0006",&local_31);
    cov::error::error(peVar2,&local_30);
    __cxa_throw(peVar2,&cov::error::typeinfo,cov::error::~error);
  }
  if (this->mDat != (proxy *)0x0) {
    return (shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *)(this->mDat->data + 1);
  }
  peVar2 = (error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"E0005",&local_31);
  cov::error::error(peVar2,&local_30);
  __cxa_throw(peVar2,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

const T &const_val() const
		{
			if (typeid(T) != this->type())
				throw cov::error("E0006");
			if (this->mDat == nullptr)
				throw cov::error("E0005");
			return static_cast<holder<T> *>(this->mDat->data)->data();
		}